

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O2

collision_shape_ptr __thiscall
APhyBullet::BulletEngine::createCylinderY
          (BulletEngine *this,aphy_scalar half_width,aphy_scalar half_height,aphy_scalar half_depth)

{
  collision_shape_ptr prVar1;
  btCylinderShape *this_00;
  collision_shape_ptr local_28;
  btVector3 local_20;
  
  this_00 = (btCylinderShape *)btCylinderShape::operator_new(0x48);
  local_20.m_floats[3] = 0.0;
  local_20.m_floats[0] = half_width;
  local_20.m_floats[1] = half_height;
  local_20.m_floats[2] = half_depth;
  btCylinderShape::btCylinderShape(this_00,&local_20);
  aphy::
  makeObjectWithInterface<aphy::collision_shape,APhyBullet::BulletCollisionShape,btCylinderShape*>
            ((aphy *)&local_28,this_00);
  prVar1 = local_28;
  local_28 = (collision_shape_ptr)0x0;
  aphy::ref<aphy::collision_shape>::~ref((ref<aphy::collision_shape> *)&local_28);
  return prVar1;
}

Assistant:

collision_shape_ptr BulletEngine::createCylinderY(aphy_scalar half_width, aphy_scalar half_height, aphy_scalar half_depth)
{
    return makeObject<BulletCollisionShape> (
        new btCylinderShape(btVector3(half_width, half_height, half_depth))
    ).disown();
}